

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

string * GetAutogenTargetBuildDir_abi_cxx11_
                   (string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  string local_30;
  
  GetSafeProperty_abi_cxx11_(__return_storage_ptr__,target,"AUTOGEN_BUILD_DIR");
  if (__return_storage_ptr__->_M_string_length == 0) {
    cmMakefile::GetCurrentBinaryDirectory(target->Target->Makefile);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    GetAutogenTargetName_abi_cxx11_(&local_30,target);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetAutogenTargetBuildDir(cmGeneratorTarget const* target)
{
  std::string targetDir = GetSafeProperty(target, "AUTOGEN_BUILD_DIR");
  if (targetDir.empty()) {
    cmMakefile* makefile = target->Target->GetMakefile();
    targetDir = makefile->GetCurrentBinaryDirectory();
    targetDir += "/";
    targetDir += GetAutogenTargetName(target);
  }
  return targetDir;
}